

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O3

void __thiscall testing::internal::UnitTestImpl::UnshuffleTests(UnitTestImpl *this)

{
  undefined1 auVar1 [64];
  pointer ppTVar2;
  pointer piVar3;
  TestCase *pTVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  
  ppTVar2 = (this->test_cases_).
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar6 = (long)(this->test_cases_).
                super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2;
  if (lVar6 != 0) {
    auVar10 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar11 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar12 = vpmovsxbd_avx512f(_DAT_004a54f0);
    auVar13 = vpbroadcastq_avx512f(ZEXT816(0x10));
    auVar14 = vpbroadcastd_avx512f(ZEXT416(0x10));
    piVar3 = (this->test_case_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = lVar6 >> 3;
    lVar7 = 0;
    do {
      pTVar4 = ppTVar2[lVar7];
      lVar5 = *(long *)&(pTVar4->test_indices_).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data;
      lVar8 = (long)*(pointer *)
                     ((long)&(pTVar4->test_indices_).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl + 8) - lVar5;
      if (lVar8 != 0) {
        lVar8 = lVar8 >> 2;
        auVar15 = vmovdqa64_avx512f(auVar11);
        auVar16 = vmovdqa64_avx512f(auVar10);
        auVar17 = vmovdqa64_avx512f(auVar12);
        auVar18 = vpbroadcastq_avx512f();
        uVar9 = 0;
        do {
          vpcmpuq_avx512f(auVar15,auVar18,2);
          vpcmpuq_avx512f(auVar16,auVar18,2);
          auVar15 = vpaddq_avx512f(auVar15,auVar13);
          auVar16 = vpaddq_avx512f(auVar16,auVar13);
          auVar1 = vmovdqu32_avx512f(auVar17);
          *(undefined1 (*) [64])(lVar5 + uVar9 * 4) = auVar1;
          uVar9 = uVar9 + 0x10;
          auVar17 = vpaddd_avx512f(auVar17,auVar14);
        } while ((lVar8 + (ulong)(lVar8 == 0) + 0xf & 0xfffffffffffffff0) != uVar9);
      }
      piVar3[lVar7] = (int)lVar7;
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar6 + (ulong)(lVar6 == 0));
  }
  return;
}

Assistant:

void UnitTestImpl::UnshuffleTests() {
  for (size_t i = 0; i < test_cases_.size(); i++) {
    // Unshuffles the tests in each test case.
    test_cases_[i]->UnshuffleTests();
    // Resets the index of each test case.
    test_case_indices_[i] = static_cast<int>(i);
  }
}